

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  xml_attribute local_40;
  xml_attribute local_38;
  
  uVar5 = pred.prefix_length;
  pcVar8 = pred.prefix;
  if (this->_root != (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute(&local_38,this->_root->first_attribute);
    local_40._attr = local_38._attr;
    if (local_38._attr != (xml_attribute_struct *)0x0) {
      do {
        pcVar4 = (local_38._attr)->name;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "";
        }
        if (*pcVar4 == 'x') {
          lVar6 = 0;
          do {
            lVar2 = lVar6 + 1;
            if (lVar6 == 4) break;
            lVar3 = lVar6 + 1;
            lVar6 = lVar6 + 1;
          } while (pcVar4[lVar3] == "xmlns"[lVar2]);
          if ("xmlns"[lVar2] == '\0') {
            pcVar7 = pcVar4 + 5;
            if (pcVar8 == (char *)0x0) {
LAB_00192816:
              if (*pcVar7 == '\0') {
                return (xml_attribute)local_38._attr;
              }
            }
            else if (*pcVar7 == ':') {
              if (uVar5 == 0) {
LAB_00192813:
                pcVar7 = pcVar4 + 6 + uVar5;
                goto LAB_00192816;
              }
              if (pcVar4[6] == *pcVar8) {
                uVar9 = 0;
                do {
                  if (uVar5 - 1 == uVar9) goto LAB_00192813;
                  lVar6 = uVar9 + 7;
                  uVar1 = uVar9 + 1;
                  lVar2 = uVar9 + 1;
                  uVar9 = uVar1;
                } while (pcVar4[lVar6] == pcVar8[lVar2]);
                if (uVar5 <= uVar1) goto LAB_00192813;
              }
            }
          }
        }
        xml_attribute::xml_attribute(&local_38,(local_38._attr)->next_attribute);
        local_40._attr = local_38._attr;
      } while (local_38._attr != (xml_attribute_struct *)0x0);
    }
  }
  xml_attribute::xml_attribute(&local_40);
  return (xml_attribute)local_40._attr;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}